

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O1

void QMutableEventPoint::detach(QEventPoint *p)

{
  QEventPointPrivate *pQVar1;
  
  pQVar1 = (p->d).d.ptr;
  if (pQVar1 == (QEventPointPrivate *)0x0) {
    pQVar1 = (QEventPointPrivate *)operator_new(0xe0);
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    memset(&pQVar1->device,0,0x88);
    pQVar1->pressure = 1.0;
    pQVar1->rotation = 0.0;
    (pQVar1->ellipseDiameters).wd = 0.0;
    (pQVar1->ellipseDiameters).ht = 0.0;
    *(undefined8 *)(pQVar1->velocity).v = 0;
    pQVar1->timestamp = 0;
    pQVar1->lastTimestamp = 0;
    pQVar1->pressTimestamp = 0;
    (pQVar1->uniqueId).m_numericId = -1;
    pQVar1->pointId = -1;
    pQVar1->state = Unknown;
    pQVar1->accept = false;
    QExplicitlySharedDataPointer<QEventPointPrivate>::reset(&p->d,pQVar1);
    return;
  }
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1) {
    return;
  }
  QExplicitlySharedDataPointer<QEventPointPrivate>::detach_helper(&p->d);
  return;
}

Assistant:

void QMutableEventPoint::detach(QEventPoint &p)
{
    if (p.d)
        p.d.detach();
    else
        p.d.reset(new QEventPointPrivate(-1, nullptr));
}